

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SparseKeyTest<1536,Blob<160>>
               (hashfunc<Blob<160>_> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  byte bVar1;
  bool bVar2;
  pfHash p_Var3;
  size_type sVar4;
  byte bVar5;
  undefined4 in_ECX;
  byte bVar6;
  uint in_EDX;
  char *pcVar7;
  byte bVar8;
  uint in_ESI;
  byte in_R8B;
  byte in_R9B;
  bool result;
  Blob<160> h;
  keytype k;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> hashes;
  undefined3 uVar9;
  undefined4 in_stack_fffffffffffffef4;
  byte bVar11;
  undefined4 uVar10;
  Blob<1536> *in_stack_fffffffffffffef8;
  uint8_t in_stack_ffffffffffffff07;
  int in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  pfHash in_stack_ffffffffffffff10;
  Blob<1536> local_e8;
  undefined1 in_stack_ffffffffffffffeb;
  undefined1 in_stack_ffffffffffffffec;
  undefined1 in_stack_ffffffffffffffed;
  undefined1 in_stack_ffffffffffffffee;
  undefined1 in_stack_ffffffffffffffef;
  uint uVar12;
  hashfunc local_8 [8];
  
  bVar8 = (byte)in_EDX & 1;
  bVar6 = (byte)in_ECX & 1;
  bVar5 = in_R8B & 1;
  bVar1 = in_R9B & 1;
  pcVar7 = "exactly";
  if ((in_EDX & 1) != 0) {
    pcVar7 = "up to";
  }
  uVar12 = in_ESI;
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x600,pcVar7,(ulong)in_ESI);
  std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::vector
            ((vector<Blob<160>,_std::allocator<Blob<160>_>_> *)0x16f44f);
  Blob<1536>::Blob(&local_e8);
  memset(&local_e8,0,0xc0);
  if ((bVar8 & 1) != 0) {
    Blob<160>::Blob((Blob<160> *)&stack0xfffffffffffffef8);
    p_Var3 = hashfunc::operator_cast_to_function_pointer(local_8);
    (*p_Var3)(&local_e8,0xc0,0,&stack0xfffffffffffffef8);
    std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::push_back
              ((vector<Blob<160>,_std::allocator<Blob<160>_>_> *)
               CONCAT44(in_stack_fffffffffffffef4,in_ESI),(value_type *)CONCAT44(in_EDX,in_ECX));
  }
  hashfunc::operator_cast_to_function_pointer(local_8);
  SparseKeygenRecurse<Blob<1536>,Blob<160>>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08,
             (bool)in_stack_ffffffffffffff07,in_stack_fffffffffffffef8,
             (vector<Blob<160>,_std::allocator<Blob<160>_>_> *)
             CONCAT44(in_stack_fffffffffffffef4,in_ESI));
  sVar4 = std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::size
                    ((vector<Blob<160>,_std::allocator<Blob<160>_>_> *)&stack0xffffffffffffffd8);
  printf("%d keys\n",sVar4 & 0xffffffff);
  uVar9 = (undefined3)in_stack_fffffffffffffef4;
  bVar11 = 1;
  bVar2 = TestHashList<Blob<160>>
                    ((vector<Blob<160>,_std::allocator<Blob<160>_>_> *)
                     CONCAT44(uVar12,CONCAT13(bVar8,CONCAT12(bVar6,CONCAT11(bVar5,bVar1)))),
                     (bool)in_stack_ffffffffffffffef,(bool)in_stack_ffffffffffffffee,
                     (bool)in_stack_ffffffffffffffed,(bool)in_stack_ffffffffffffffec,
                     (bool)in_stack_ffffffffffffffeb);
  uVar10 = CONCAT13(bVar2 & bVar11,uVar9);
  printf("\n");
  std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::~vector
            ((vector<Blob<160>,_std::allocator<Blob<160>_>_> *)CONCAT44(uVar10,in_ESI));
  return (bool)((byte)((uint)uVar10 >> 0x18) & 1);
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive, bool testColl, bool testDist, bool drawDiagram  )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits, inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashtype h;

    hash(&k,sizeof(keytype),0,&h);

    hashes.push_back(h);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}